

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessSessionIdJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *param_2)

{
  string *this_00;
  ErrorCode EVar1;
  element_type *peVar2;
  uint __len;
  uint16_t sessionId;
  string __str;
  ushort local_ca;
  string *local_c8;
  string local_c0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ErrorCode local_58 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  peVar2 = (aCommissioner->
           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x12])(local_58,peVar2,&local_ca);
  local_a0._0_4_ = local_58[0];
  local_98._M_p = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_50,local_50 + local_48);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_a0._0_4_;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  local_c8 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_78);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p);
  }
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (EVar1 == kNone) {
    __len = 1;
    if (((9 < local_ca) && (__len = 2, 99 < local_ca)) && (__len = 3, 999 < local_ca)) {
      __len = 5 - (local_ca < 10000);
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_c0._M_dataplus._M_p,__len,(uint)local_ca);
    Value::Value((Value *)local_a0,&local_c0);
    (__return_storage_ptr__->mError).mCode = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
    std::__cxx11::string::operator=(local_c8,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessSessionIdJob(CommissionerAppPtr &aCommissioner, const Expression &)
{
    Value    value;
    uint16_t sessionId;

    SuccessOrExit(value = aCommissioner->GetSessionId(sessionId));
    value = std::to_string(sessionId);

exit:
    return value;
}